

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Option<unsigned_long> __thiscall Catch::list(Catch *this,shared_ptr<Catch::Config> *config)

{
  long *plVar1;
  size_t sVar2;
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char extraout_RDX_01 [8];
  char extraout_RDX_02 [8];
  char extraout_RDX_03 [8];
  char extraout_RDX_04 [8];
  char acVar3 [8];
  element_type *config_00;
  long lVar4;
  Option<unsigned_long> OVar5;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  *(undefined8 *)this = 0;
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = (long)&PTR__Context_0019fa90;
    IMutableContext::currentContext[1] = (long)&PTR__Context_0019fae0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  plVar1 = IMutableContext::currentContext;
  local_28 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar1 + 0x38))(plVar1,&local_28);
  acVar3 = extraout_RDX;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    acVar3 = extraout_RDX_00;
  }
  config_00 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((config_00->m_data).listTests == true) {
    if (*(long **)this == (long *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = **(long **)this;
    }
    sVar2 = listTests(config_00);
    *(size_t *)(this + 8) = sVar2 + lVar4;
    *(Catch **)this = this + 8;
    config_00 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    acVar3 = extraout_RDX_01;
  }
  if ((config_00->m_data).listTestNamesOnly == true) {
    if (*(long **)this == (long *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = **(long **)this;
    }
    sVar2 = listTestsNamesOnly(config_00);
    *(size_t *)(this + 8) = sVar2 + lVar4;
    *(Catch **)this = this + 8;
    config_00 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    acVar3 = extraout_RDX_02;
  }
  if ((config_00->m_data).listTags == true) {
    if (*(long **)this == (long *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = **(long **)this;
    }
    sVar2 = listTags(config_00);
    *(size_t *)(this + 8) = sVar2 + lVar4;
    *(Catch **)this = this + 8;
    config_00 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    acVar3 = extraout_RDX_03;
  }
  if ((config_00->m_data).listReporters == true) {
    if (*(long **)this == (long *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = **(long **)this;
    }
    sVar2 = listReporters();
    *(size_t *)(this + 8) = sVar2 + lVar4;
    *(Catch **)this = this + 8;
    acVar3 = extraout_RDX_04;
  }
  OVar5.storage[0] = acVar3[0];
  OVar5.storage[1] = acVar3[1];
  OVar5.storage[2] = acVar3[2];
  OVar5.storage[3] = acVar3[3];
  OVar5.storage[4] = acVar3[4];
  OVar5.storage[5] = acVar3[5];
  OVar5.storage[6] = acVar3[6];
  OVar5.storage[7] = acVar3[7];
  OVar5.nullableValue = (unsigned_long *)this;
  return OVar5;
}

Assistant:

Option<std::size_t> list( std::shared_ptr<Config> const& config ) {
        Option<std::size_t> listedCount;
        getCurrentMutableContext().setConfig( config );
        if( config->listTests() )
            listedCount = listedCount.valueOr(0) + listTests( *config );
        if( config->listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( *config );
        if( config->listTags() )
            listedCount = listedCount.valueOr(0) + listTags( *config );
        if( config->listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters();
        return listedCount;
    }